

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint_t __thiscall shm_test::ServerThread::threadFunc(ServerThread *this)

{
  C *pCVar1;
  long in_RDI;
  ReqHdr reply;
  ReqHdr *command;
  size_t size;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff70;
  undefined4 local_78;
  uint local_74;
  uint *local_70;
  undefined4 local_64;
  ulong local_30;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_28;
  uint_t local_4;
  
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x130f46);
  do {
    local_30 = (**(code **)**(undefined8 **)(in_RDI + 0x10))
                         (*(undefined8 **)(in_RDI + 0x10),&local_28);
    if (local_30 == 0xffffffffffffffff) {
      axl::err::getLastErrorDescription();
      pCVar1 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         (in_stack_ffffffffffffff70);
      printf("server: read error: %s\n",pCVar1);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x130fb5);
LAB_001310c7:
      local_4 = 0xffffffff;
      local_64 = 1;
      axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
                ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1310d1);
      return local_4;
    }
    if (local_30 < 8) {
      printf("server: buffer too small\n");
      goto LAB_001310c7;
    }
    local_70 = (uint *)axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::cp(&local_28);
    if ((*local_70 != 0) || ((ulong)local_70[1] + 8 != local_30)) {
      printf("server: invalid command: %d (%d)\n",(ulong)*local_70,(ulong)local_70[1]);
      goto LAB_001310c7;
    }
    local_78 = 1;
    local_74 = local_70[1];
    (**(code **)(**(long **)(in_RDI + 0x10) + 8))
              (*(long **)(in_RDI + 0x10),&local_78,threadFunc::data,local_74);
  } while( true );
}

Assistant:

uint_t
	threadFunc() {
		ASSERT(m_transport);

		sl::Array<char> buffer;

		static char data[MaxBlockSize] = { 0 };

		for (;;) {
			size_t size = m_transport->readMessage(&buffer);
			if (size == -1) {
				printf("server: read error: %s\n", err::getLastErrorDescription().sz());
				return -1;
			}

			if (size < sizeof(ReqHdr)) {
				printf("server: buffer too small\n");
				return -1;
			}

			ReqHdr* command = (ReqHdr*)buffer.cp();
			if (command->m_code != ReqCode_Command || sizeof(ReqHdr) + command->m_size != size) {
				printf("server: invalid command: %d (%d)\n", command->m_code, command->m_size);
				return -1;
			}

			ReqHdr reply;
			reply.m_code = ReqCode_Reply;
			reply.m_size = command->m_size;

			m_transport->writeMessage(&reply, data, reply.m_size);
		}

		return 0;
	}